

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singlylinkedlist.c
# Opt level: O0

LIST_ITEM_HANDLE singlylinkedlist_add_head(SINGLYLINKEDLIST_HANDLE list,void *item)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  LIST_ITEM_HANDLE result;
  void *item_local;
  SINGLYLINKEDLIST_HANDLE list_local;
  
  if (list == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/singlylinkedlist.c"
                ,"singlylinkedlist_add_head",0x17f,1,
                "Invalid argument SINGLYLINKEDLIST_HANDLE list=%p",0);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x10);
    if ((LIST_ITEM_INSTANCE *)l == (LIST_ITEM_INSTANCE *)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/singlylinkedlist.c"
                  ,"singlylinkedlist_add_head",0x189,1,"failure in malloc");
      }
    }
    else {
      ((LIST_ITEM_INSTANCE *)l)->item = item;
      if (list->head == (LIST_ITEM_INSTANCE *)0x0) {
        ((LIST_ITEM_INSTANCE *)l)->next = (void *)0x0;
        list->head = (LIST_ITEM_INSTANCE *)l;
        list->tail = (LIST_ITEM_INSTANCE *)l;
      }
      else {
        ((LIST_ITEM_INSTANCE *)l)->next = list->head;
        list->head = (LIST_ITEM_INSTANCE *)l;
      }
    }
  }
  return (LIST_ITEM_HANDLE)l;
}

Assistant:

LIST_ITEM_HANDLE singlylinkedlist_add_head(SINGLYLINKEDLIST_HANDLE list, const void* item)
{
    LIST_ITEM_HANDLE result;

    /* Codes_SRS_LIST_02_001: [ If list is NULL then singlylinkedlist_add_head shall fail and return NULL. ]*/
    if (list == NULL)
    {
        LogError("Invalid argument SINGLYLINKEDLIST_HANDLE list=%p", list);
        result = NULL;
    }
    else
    {
        result = malloc(sizeof(LIST_ITEM_INSTANCE));

        if (result == NULL)
        {
            /*Codes_SRS_LIST_02_003: [ If there are any failures then singlylinkedlist_add_head shall fail and return NULL. ]*/
            LogError("failure in malloc");
            /*return as is*/
        }
        else
        {
            /*Codes_SRS_LIST_02_002: [ singlylinkedlist_add_head shall insert item at head, succeed and return a non-NULL value. ]*/
            result->item = item;
            if (list->head == NULL)
            {
                result->next = NULL;
                list->head = result;
                list->tail = result;
                
            }
            else
            {
                result->next = list->head;
                list->head = result;
            }
        }
    }

    return result;
}